

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::CwiseQuotient::backward_impl
          (CwiseQuotient *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  pointer ppTVar1;
  Tensor *pTVar2;
  Tensor *pTVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  byte bVar11;
  byte bVar12;
  Index size;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ushort uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  int iVar38;
  int iVar39;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  sub_assign_op<float,_float> local_d9;
  float *local_d8;
  ulong local_d0;
  SrcEvaluatorType local_c0;
  DstEvaluatorType local_48;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
  local_30;
  
  if (1 < i) {
    __assert_fail("i < 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                  ,0x6d3,
                  "virtual void cnn::CwiseQuotient::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  ppTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (i == 0) {
    pTVar2 = ppTVar1[1];
    uVar13 = (ulong)(pTVar2->d).nd;
    iVar39 = 1;
    iVar38 = 1;
    if (uVar13 != 0) {
      auVar23 = vpbroadcastq_avx512f();
      auVar24 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar16 = 0;
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar27 = vmovdqa64_avx512f(auVar24);
        auVar24 = vpbroadcastq_avx512f();
        auVar28 = vporq_avx512f(auVar24,auVar25);
        auVar24 = vporq_avx512f(auVar24,auVar26);
        uVar10 = vpcmpuq_avx512f(auVar24,auVar23,2);
        bVar11 = (byte)uVar10;
        uVar10 = vpcmpuq_avx512f(auVar28,auVar23,2);
        bVar12 = (byte)uVar10;
        uVar21 = CONCAT11(bVar12,bVar11);
        auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar16));
        auVar28._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar24._4_4_;
        auVar28._0_4_ = (uint)(bVar11 & 1) * auVar24._0_4_;
        auVar28._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar24._8_4_;
        auVar28._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar24._12_4_;
        auVar28._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar24._16_4_;
        auVar28._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar24._20_4_;
        auVar28._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar24._24_4_;
        auVar28._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar24._28_4_;
        auVar28._32_4_ = (uint)(bVar12 & 1) * auVar24._32_4_;
        auVar28._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar24._36_4_;
        auVar28._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar24._40_4_;
        auVar28._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar24._44_4_;
        auVar28._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar24._48_4_;
        auVar28._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar24._52_4_;
        auVar28._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar24._56_4_;
        auVar28._60_4_ = (uint)(bVar12 >> 7) * auVar24._60_4_;
        auVar24 = vpmulld_avx512f(auVar28,auVar27);
        uVar16 = uVar16 + 0x10;
      } while ((uVar13 + 0xf & 0x1fffffff0) != uVar16);
      auVar23 = vmovdqa32_avx512f(auVar24);
      auVar24._0_4_ = (uint)(bVar11 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar27._0_4_
      ;
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar24._4_4_ = (uint)bVar7 * auVar23._4_4_ | (uint)!bVar7 * auVar27._4_4_;
      bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar24._8_4_ = (uint)bVar7 * auVar23._8_4_ | (uint)!bVar7 * auVar27._8_4_;
      bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar24._12_4_ = (uint)bVar7 * auVar23._12_4_ | (uint)!bVar7 * auVar27._12_4_;
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar24._16_4_ = (uint)bVar7 * auVar23._16_4_ | (uint)!bVar7 * auVar27._16_4_;
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar24._20_4_ = (uint)bVar7 * auVar23._20_4_ | (uint)!bVar7 * auVar27._20_4_;
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar24._24_4_ = (uint)bVar7 * auVar23._24_4_ | (uint)!bVar7 * auVar27._24_4_;
      bVar7 = (bool)((byte)(uVar21 >> 7) & 1);
      auVar24._28_4_ = (uint)bVar7 * auVar23._28_4_ | (uint)!bVar7 * auVar27._28_4_;
      auVar24._32_4_ =
           (uint)(bVar12 & 1) * auVar23._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar27._32_4_;
      bVar7 = (bool)(bVar12 >> 1 & 1);
      auVar24._36_4_ = (uint)bVar7 * auVar23._36_4_ | (uint)!bVar7 * auVar27._36_4_;
      bVar7 = (bool)(bVar12 >> 2 & 1);
      auVar24._40_4_ = (uint)bVar7 * auVar23._40_4_ | (uint)!bVar7 * auVar27._40_4_;
      bVar7 = (bool)(bVar12 >> 3 & 1);
      auVar24._44_4_ = (uint)bVar7 * auVar23._44_4_ | (uint)!bVar7 * auVar27._44_4_;
      bVar7 = (bool)(bVar12 >> 4 & 1);
      auVar24._48_4_ = (uint)bVar7 * auVar23._48_4_ | (uint)!bVar7 * auVar27._48_4_;
      bVar7 = (bool)(bVar12 >> 5 & 1);
      auVar24._52_4_ = (uint)bVar7 * auVar23._52_4_ | (uint)!bVar7 * auVar27._52_4_;
      bVar7 = (bool)(bVar12 >> 6 & 1);
      auVar24._56_4_ = (uint)bVar7 * auVar23._56_4_ | (uint)!bVar7 * auVar27._56_4_;
      auVar24._60_4_ =
           (uint)(bVar12 >> 7) * auVar23._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar27._60_4_;
      auVar22 = vextracti64x4_avx512f(auVar24,1);
      auVar23 = vpmulld_avx512f(auVar24,ZEXT3264(auVar22));
      auVar8 = vpmulld_avx(auVar23._0_16_,auVar23._16_16_);
      auVar9 = vpshufd_avx(auVar8,0xee);
      auVar8 = vpmulld_avx(auVar8,auVar9);
      auVar9 = vpshufd_avx(auVar8,0x55);
      auVar8 = vpmulld_avx(auVar8,auVar9);
      iVar38 = auVar8._0_4_;
    }
    uVar15 = iVar38 * (pTVar2->d).bd;
    uVar13 = (ulong)(dEdf->d).nd;
    if (uVar13 != 0) {
      auVar23 = vpbroadcastq_avx512f();
      auVar24 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar16 = 0;
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar27 = vmovdqa64_avx512f(auVar24);
        auVar24 = vpbroadcastq_avx512f();
        auVar28 = vporq_avx512f(auVar24,auVar25);
        auVar24 = vporq_avx512f(auVar24,auVar26);
        uVar10 = vpcmpuq_avx512f(auVar24,auVar23,2);
        bVar11 = (byte)uVar10;
        uVar10 = vpcmpuq_avx512f(auVar28,auVar23,2);
        bVar12 = (byte)uVar10;
        uVar21 = CONCAT11(bVar12,bVar11);
        auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar16));
        auVar34._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar24._4_4_;
        auVar34._0_4_ = (uint)(bVar11 & 1) * auVar24._0_4_;
        auVar34._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar24._8_4_;
        auVar34._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar24._12_4_;
        auVar34._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar24._16_4_;
        auVar34._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar24._20_4_;
        auVar34._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar24._24_4_;
        auVar34._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar24._28_4_;
        auVar34._32_4_ = (uint)(bVar12 & 1) * auVar24._32_4_;
        auVar34._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar24._36_4_;
        auVar34._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar24._40_4_;
        auVar34._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar24._44_4_;
        auVar34._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar24._48_4_;
        auVar34._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar24._52_4_;
        auVar34._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar24._56_4_;
        auVar34._60_4_ = (uint)(bVar12 >> 7) * auVar24._60_4_;
        auVar24 = vpmulld_avx512f(auVar34,auVar27);
        uVar16 = uVar16 + 0x10;
      } while ((uVar13 + 0xf & 0x1fffffff0) != uVar16);
      auVar23 = vmovdqa32_avx512f(auVar24);
      auVar25._0_4_ = (uint)(bVar11 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar27._0_4_
      ;
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar25._4_4_ = (uint)bVar7 * auVar23._4_4_ | (uint)!bVar7 * auVar27._4_4_;
      bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar25._8_4_ = (uint)bVar7 * auVar23._8_4_ | (uint)!bVar7 * auVar27._8_4_;
      bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar25._12_4_ = (uint)bVar7 * auVar23._12_4_ | (uint)!bVar7 * auVar27._12_4_;
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar25._16_4_ = (uint)bVar7 * auVar23._16_4_ | (uint)!bVar7 * auVar27._16_4_;
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar25._20_4_ = (uint)bVar7 * auVar23._20_4_ | (uint)!bVar7 * auVar27._20_4_;
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar25._24_4_ = (uint)bVar7 * auVar23._24_4_ | (uint)!bVar7 * auVar27._24_4_;
      bVar7 = (bool)((byte)(uVar21 >> 7) & 1);
      auVar25._28_4_ = (uint)bVar7 * auVar23._28_4_ | (uint)!bVar7 * auVar27._28_4_;
      auVar25._32_4_ =
           (uint)(bVar12 & 1) * auVar23._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar27._32_4_;
      bVar7 = (bool)(bVar12 >> 1 & 1);
      auVar25._36_4_ = (uint)bVar7 * auVar23._36_4_ | (uint)!bVar7 * auVar27._36_4_;
      bVar7 = (bool)(bVar12 >> 2 & 1);
      auVar25._40_4_ = (uint)bVar7 * auVar23._40_4_ | (uint)!bVar7 * auVar27._40_4_;
      bVar7 = (bool)(bVar12 >> 3 & 1);
      auVar25._44_4_ = (uint)bVar7 * auVar23._44_4_ | (uint)!bVar7 * auVar27._44_4_;
      bVar7 = (bool)(bVar12 >> 4 & 1);
      auVar25._48_4_ = (uint)bVar7 * auVar23._48_4_ | (uint)!bVar7 * auVar27._48_4_;
      bVar7 = (bool)(bVar12 >> 5 & 1);
      auVar25._52_4_ = (uint)bVar7 * auVar23._52_4_ | (uint)!bVar7 * auVar27._52_4_;
      bVar7 = (bool)(bVar12 >> 6 & 1);
      auVar25._56_4_ = (uint)bVar7 * auVar23._56_4_ | (uint)!bVar7 * auVar27._56_4_;
      auVar25._60_4_ =
           (uint)(bVar12 >> 7) * auVar23._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar27._60_4_;
      auVar22 = vextracti64x4_avx512f(auVar25,1);
      auVar23 = vpmulld_avx512f(auVar25,ZEXT3264(auVar22));
      auVar8 = vpmulld_avx(auVar23._0_16_,auVar23._16_16_);
      auVar9 = vpshufd_avx(auVar8,0xee);
      auVar8 = vpmulld_avx(auVar8,auVar9);
      auVar9 = vpshufd_avx(auVar8,0x55);
      auVar8 = vpmulld_avx(auVar8,auVar9);
      iVar39 = auVar8._0_4_;
    }
    if (iVar39 * (dEdf->d).bd == uVar15) {
      uVar13 = (ulong)(dEdxi->d).nd;
      if (uVar13 == 0) {
        iVar38 = 1;
      }
      else {
        auVar23 = vpbroadcastq_avx512f();
        auVar24 = vpbroadcastd_avx512f(ZEXT416(1));
        uVar16 = 0;
        auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar27 = vmovdqa64_avx512f(auVar24);
          auVar24 = vpbroadcastq_avx512f();
          auVar28 = vporq_avx512f(auVar24,auVar25);
          auVar24 = vporq_avx512f(auVar24,auVar26);
          uVar10 = vpcmpuq_avx512f(auVar24,auVar23,2);
          bVar11 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar28,auVar23,2);
          bVar12 = (byte)uVar10;
          uVar21 = CONCAT11(bVar12,bVar11);
          auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar16));
          auVar35._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar24._4_4_;
          auVar35._0_4_ = (uint)(bVar11 & 1) * auVar24._0_4_;
          auVar35._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar24._8_4_;
          auVar35._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar24._12_4_;
          auVar35._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar24._16_4_;
          auVar35._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar24._20_4_;
          auVar35._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar24._24_4_;
          auVar35._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar24._28_4_;
          auVar35._32_4_ = (uint)(bVar12 & 1) * auVar24._32_4_;
          auVar35._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar24._36_4_;
          auVar35._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar24._40_4_;
          auVar35._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar24._44_4_;
          auVar35._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar24._48_4_;
          auVar35._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar24._52_4_;
          auVar35._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar24._56_4_;
          auVar35._60_4_ = (uint)(bVar12 >> 7) * auVar24._60_4_;
          auVar24 = vpmulld_avx512f(auVar35,auVar27);
          uVar16 = uVar16 + 0x10;
        } while ((uVar13 + 0xf & 0x1fffffff0) != uVar16);
        auVar23 = vmovdqa32_avx512f(auVar24);
        auVar26._0_4_ =
             (uint)(bVar11 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar27._0_4_;
        bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar26._4_4_ = (uint)bVar7 * auVar23._4_4_ | (uint)!bVar7 * auVar27._4_4_;
        bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar26._8_4_ = (uint)bVar7 * auVar23._8_4_ | (uint)!bVar7 * auVar27._8_4_;
        bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar26._12_4_ = (uint)bVar7 * auVar23._12_4_ | (uint)!bVar7 * auVar27._12_4_;
        bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar26._16_4_ = (uint)bVar7 * auVar23._16_4_ | (uint)!bVar7 * auVar27._16_4_;
        bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar26._20_4_ = (uint)bVar7 * auVar23._20_4_ | (uint)!bVar7 * auVar27._20_4_;
        bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar26._24_4_ = (uint)bVar7 * auVar23._24_4_ | (uint)!bVar7 * auVar27._24_4_;
        bVar7 = (bool)((byte)(uVar21 >> 7) & 1);
        auVar26._28_4_ = (uint)bVar7 * auVar23._28_4_ | (uint)!bVar7 * auVar27._28_4_;
        auVar26._32_4_ =
             (uint)(bVar12 & 1) * auVar23._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar27._32_4_;
        bVar7 = (bool)(bVar12 >> 1 & 1);
        auVar26._36_4_ = (uint)bVar7 * auVar23._36_4_ | (uint)!bVar7 * auVar27._36_4_;
        bVar7 = (bool)(bVar12 >> 2 & 1);
        auVar26._40_4_ = (uint)bVar7 * auVar23._40_4_ | (uint)!bVar7 * auVar27._40_4_;
        bVar7 = (bool)(bVar12 >> 3 & 1);
        auVar26._44_4_ = (uint)bVar7 * auVar23._44_4_ | (uint)!bVar7 * auVar27._44_4_;
        bVar7 = (bool)(bVar12 >> 4 & 1);
        auVar26._48_4_ = (uint)bVar7 * auVar23._48_4_ | (uint)!bVar7 * auVar27._48_4_;
        bVar7 = (bool)(bVar12 >> 5 & 1);
        auVar26._52_4_ = (uint)bVar7 * auVar23._52_4_ | (uint)!bVar7 * auVar27._52_4_;
        bVar7 = (bool)(bVar12 >> 6 & 1);
        auVar26._56_4_ = (uint)bVar7 * auVar23._56_4_ | (uint)!bVar7 * auVar27._56_4_;
        auVar26._60_4_ =
             (uint)(bVar12 >> 7) * auVar23._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar27._60_4_;
        auVar22 = vextracti64x4_avx512f(auVar26,1);
        auVar23 = vpmulld_avx512f(auVar26,ZEXT3264(auVar22));
        auVar8 = vpmulld_avx(auVar23._0_16_,auVar23._16_16_);
        auVar9 = vpshufd_avx(auVar8,0xee);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        auVar9 = vpshufd_avx(auVar8,0x55);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        iVar38 = auVar8._0_4_;
      }
      uVar19 = iVar38 * (dEdxi->d).bd;
      uVar13 = (ulong)uVar19;
      if (uVar19 == uVar15) {
        pfVar4 = dEdxi->v;
        uVar16 = uVar13;
        if ((((ulong)pfVar4 & 3) == 0) &&
           (uVar16 = (ulong)(-((uint)((ulong)pfVar4 >> 2) & 0x3fffffff) & 0xf), uVar13 <= uVar16)) {
          uVar16 = uVar13;
        }
        pfVar5 = pTVar2->v;
        pfVar6 = dEdf->v;
        uVar18 = uVar13 - uVar16;
        uVar17 = uVar18 + 0xf;
        if (-1 < (long)uVar18) {
          uVar17 = uVar18;
        }
        if (uVar16 != 0) {
          uVar20 = 0;
          do {
            pfVar4[uVar20] = pfVar6[uVar20] / pfVar5[uVar20] + pfVar4[uVar20];
            uVar20 = uVar20 + 1;
          } while (uVar16 != uVar20);
        }
        uVar17 = (uVar17 & 0xfffffffffffffff0) + uVar16;
        if (0xf < (long)uVar18) {
          do {
            auVar23 = vrcp14ps_avx512f(*(undefined1 (*) [64])(pfVar5 + uVar16));
            auVar24 = vmulps_avx512f(*(undefined1 (*) [64])(pfVar6 + uVar16),auVar23);
            auVar25 = vfmsub213ps_avx512f(*(undefined1 (*) [64])(pfVar5 + uVar16),auVar24,
                                          *(undefined1 (*) [64])(pfVar6 + uVar16));
            auVar23 = vfnmadd213ps_avx512f(auVar25,auVar23,auVar24);
            auVar23 = vaddps_avx512f(auVar23,*(undefined1 (*) [64])(pfVar4 + uVar16));
            *(undefined1 (*) [64])(pfVar4 + uVar16) = auVar23;
            uVar16 = uVar16 + 0x10;
          } while ((long)uVar16 < (long)uVar17);
        }
        if ((long)uVar17 < (long)uVar13) {
          do {
            pfVar4[uVar17] = pfVar6[uVar17] / pfVar5[uVar17] + pfVar4[uVar17];
            uVar17 = uVar17 + 1;
          } while (uVar13 != uVar17);
        }
        return;
      }
      pcVar14 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
      ;
LAB_001c2949:
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar14);
    }
    pcVar14 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
    ;
  }
  else {
    pTVar2 = *ppTVar1;
    uVar13 = (ulong)(pTVar2->d).nd;
    iVar39 = 1;
    iVar38 = 1;
    if (uVar13 != 0) {
      auVar23 = vpbroadcastq_avx512f();
      auVar24 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar16 = 0;
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar27 = vmovdqa64_avx512f(auVar24);
        auVar24 = vpbroadcastq_avx512f();
        auVar28 = vporq_avx512f(auVar24,auVar25);
        auVar24 = vporq_avx512f(auVar24,auVar26);
        uVar10 = vpcmpuq_avx512f(auVar24,auVar23,2);
        bVar11 = (byte)uVar10;
        uVar10 = vpcmpuq_avx512f(auVar28,auVar23,2);
        bVar12 = (byte)uVar10;
        uVar21 = CONCAT11(bVar12,bVar11);
        auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar16));
        auVar29._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar24._4_4_;
        auVar29._0_4_ = (uint)(bVar11 & 1) * auVar24._0_4_;
        auVar29._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar24._8_4_;
        auVar29._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar24._12_4_;
        auVar29._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar24._16_4_;
        auVar29._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar24._20_4_;
        auVar29._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar24._24_4_;
        auVar29._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar24._28_4_;
        auVar29._32_4_ = (uint)(bVar12 & 1) * auVar24._32_4_;
        auVar29._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar24._36_4_;
        auVar29._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar24._40_4_;
        auVar29._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar24._44_4_;
        auVar29._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar24._48_4_;
        auVar29._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar24._52_4_;
        auVar29._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar24._56_4_;
        auVar29._60_4_ = (uint)(bVar12 >> 7) * auVar24._60_4_;
        auVar24 = vpmulld_avx512f(auVar29,auVar27);
        uVar16 = uVar16 + 0x10;
      } while ((uVar13 + 0xf & 0x1fffffff0) != uVar16);
      auVar23 = vmovdqa32_avx512f(auVar24);
      auVar30._0_4_ = (uint)(bVar11 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar27._0_4_
      ;
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar30._4_4_ = (uint)bVar7 * auVar23._4_4_ | (uint)!bVar7 * auVar27._4_4_;
      bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar30._8_4_ = (uint)bVar7 * auVar23._8_4_ | (uint)!bVar7 * auVar27._8_4_;
      bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar30._12_4_ = (uint)bVar7 * auVar23._12_4_ | (uint)!bVar7 * auVar27._12_4_;
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar30._16_4_ = (uint)bVar7 * auVar23._16_4_ | (uint)!bVar7 * auVar27._16_4_;
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar30._20_4_ = (uint)bVar7 * auVar23._20_4_ | (uint)!bVar7 * auVar27._20_4_;
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar30._24_4_ = (uint)bVar7 * auVar23._24_4_ | (uint)!bVar7 * auVar27._24_4_;
      bVar7 = (bool)((byte)(uVar21 >> 7) & 1);
      auVar30._28_4_ = (uint)bVar7 * auVar23._28_4_ | (uint)!bVar7 * auVar27._28_4_;
      auVar30._32_4_ =
           (uint)(bVar12 & 1) * auVar23._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar27._32_4_;
      bVar7 = (bool)(bVar12 >> 1 & 1);
      auVar30._36_4_ = (uint)bVar7 * auVar23._36_4_ | (uint)!bVar7 * auVar27._36_4_;
      bVar7 = (bool)(bVar12 >> 2 & 1);
      auVar30._40_4_ = (uint)bVar7 * auVar23._40_4_ | (uint)!bVar7 * auVar27._40_4_;
      bVar7 = (bool)(bVar12 >> 3 & 1);
      auVar30._44_4_ = (uint)bVar7 * auVar23._44_4_ | (uint)!bVar7 * auVar27._44_4_;
      bVar7 = (bool)(bVar12 >> 4 & 1);
      auVar30._48_4_ = (uint)bVar7 * auVar23._48_4_ | (uint)!bVar7 * auVar27._48_4_;
      bVar7 = (bool)(bVar12 >> 5 & 1);
      auVar30._52_4_ = (uint)bVar7 * auVar23._52_4_ | (uint)!bVar7 * auVar27._52_4_;
      bVar7 = (bool)(bVar12 >> 6 & 1);
      auVar30._56_4_ = (uint)bVar7 * auVar23._56_4_ | (uint)!bVar7 * auVar27._56_4_;
      auVar30._60_4_ =
           (uint)(bVar12 >> 7) * auVar23._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar27._60_4_;
      auVar22 = vextracti64x4_avx512f(auVar30,1);
      auVar23 = vpmulld_avx512f(auVar30,ZEXT3264(auVar22));
      auVar8 = vpmulld_avx(auVar23._0_16_,auVar23._16_16_);
      auVar9 = vpshufd_avx(auVar8,0xee);
      auVar8 = vpmulld_avx(auVar8,auVar9);
      auVar9 = vpshufd_avx(auVar8,0x55);
      auVar8 = vpmulld_avx(auVar8,auVar9);
      iVar38 = auVar8._0_4_;
    }
    pTVar3 = ppTVar1[1];
    uVar13 = (ulong)(pTVar3->d).nd;
    if (uVar13 != 0) {
      auVar23 = vpbroadcastq_avx512f();
      auVar24 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar16 = 0;
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar27 = vmovdqa64_avx512f(auVar24);
        auVar24 = vpbroadcastq_avx512f();
        auVar28 = vporq_avx512f(auVar24,auVar25);
        auVar24 = vporq_avx512f(auVar24,auVar26);
        uVar10 = vpcmpuq_avx512f(auVar24,auVar23,2);
        bVar11 = (byte)uVar10;
        uVar10 = vpcmpuq_avx512f(auVar28,auVar23,2);
        bVar12 = (byte)uVar10;
        uVar21 = CONCAT11(bVar12,bVar11);
        auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar3->d).d + uVar16));
        auVar31._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar24._4_4_;
        auVar31._0_4_ = (uint)(bVar11 & 1) * auVar24._0_4_;
        auVar31._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar24._8_4_;
        auVar31._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar24._12_4_;
        auVar31._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar24._16_4_;
        auVar31._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar24._20_4_;
        auVar31._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar24._24_4_;
        auVar31._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar24._28_4_;
        auVar31._32_4_ = (uint)(bVar12 & 1) * auVar24._32_4_;
        auVar31._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar24._36_4_;
        auVar31._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar24._40_4_;
        auVar31._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar24._44_4_;
        auVar31._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar24._48_4_;
        auVar31._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar24._52_4_;
        auVar31._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar24._56_4_;
        auVar31._60_4_ = (uint)(bVar12 >> 7) * auVar24._60_4_;
        auVar24 = vpmulld_avx512f(auVar31,auVar27);
        uVar16 = uVar16 + 0x10;
      } while ((uVar13 + 0xf & 0x1fffffff0) != uVar16);
      auVar24 = vmovdqa32_avx512f(auVar24);
      auVar23._0_4_ = (uint)(bVar11 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar27._0_4_
      ;
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar23._4_4_ = (uint)bVar7 * auVar24._4_4_ | (uint)!bVar7 * auVar27._4_4_;
      bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar23._8_4_ = (uint)bVar7 * auVar24._8_4_ | (uint)!bVar7 * auVar27._8_4_;
      bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar23._12_4_ = (uint)bVar7 * auVar24._12_4_ | (uint)!bVar7 * auVar27._12_4_;
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar23._16_4_ = (uint)bVar7 * auVar24._16_4_ | (uint)!bVar7 * auVar27._16_4_;
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar23._20_4_ = (uint)bVar7 * auVar24._20_4_ | (uint)!bVar7 * auVar27._20_4_;
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar23._24_4_ = (uint)bVar7 * auVar24._24_4_ | (uint)!bVar7 * auVar27._24_4_;
      bVar7 = (bool)((byte)(uVar21 >> 7) & 1);
      auVar23._28_4_ = (uint)bVar7 * auVar24._28_4_ | (uint)!bVar7 * auVar27._28_4_;
      auVar23._32_4_ =
           (uint)(bVar12 & 1) * auVar24._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar27._32_4_;
      bVar7 = (bool)(bVar12 >> 1 & 1);
      auVar23._36_4_ = (uint)bVar7 * auVar24._36_4_ | (uint)!bVar7 * auVar27._36_4_;
      bVar7 = (bool)(bVar12 >> 2 & 1);
      auVar23._40_4_ = (uint)bVar7 * auVar24._40_4_ | (uint)!bVar7 * auVar27._40_4_;
      bVar7 = (bool)(bVar12 >> 3 & 1);
      auVar23._44_4_ = (uint)bVar7 * auVar24._44_4_ | (uint)!bVar7 * auVar27._44_4_;
      bVar7 = (bool)(bVar12 >> 4 & 1);
      auVar23._48_4_ = (uint)bVar7 * auVar24._48_4_ | (uint)!bVar7 * auVar27._48_4_;
      bVar7 = (bool)(bVar12 >> 5 & 1);
      auVar23._52_4_ = (uint)bVar7 * auVar24._52_4_ | (uint)!bVar7 * auVar27._52_4_;
      bVar7 = (bool)(bVar12 >> 6 & 1);
      auVar23._56_4_ = (uint)bVar7 * auVar24._56_4_ | (uint)!bVar7 * auVar27._56_4_;
      auVar23._60_4_ =
           (uint)(bVar12 >> 7) * auVar24._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar27._60_4_;
      auVar22 = vextracti64x4_avx512f(auVar23,1);
      auVar23 = vpmulld_avx512f(auVar23,ZEXT3264(auVar22));
      auVar8 = vpmulld_avx(auVar23._0_16_,auVar23._16_16_);
      auVar9 = vpshufd_avx(auVar8,0xee);
      auVar8 = vpmulld_avx(auVar8,auVar9);
      auVar9 = vpshufd_avx(auVar8,0x55);
      auVar8 = vpmulld_avx(auVar8,auVar9);
      iVar39 = auVar8._0_4_;
    }
    uVar15 = iVar39 * (pTVar3->d).bd;
    local_c0.
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
    .m_d.lhsImpl.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
    .m_d.rhsImpl.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
    .m_d.lhsImpl.
    super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>.
    super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
    .m_outerStride.m_value = (long)uVar15;
    uVar13 = (ulong)(dEdf->d).nd;
    if (uVar13 == 0) {
      iVar39 = 1;
    }
    else {
      auVar23 = vpbroadcastq_avx512f();
      auVar24 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar16 = 0;
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar27 = vmovdqa64_avx512f(auVar24);
        auVar24 = vpbroadcastq_avx512f();
        auVar28 = vporq_avx512f(auVar24,auVar25);
        auVar24 = vporq_avx512f(auVar24,auVar26);
        uVar10 = vpcmpuq_avx512f(auVar24,auVar23,2);
        bVar11 = (byte)uVar10;
        uVar10 = vpcmpuq_avx512f(auVar28,auVar23,2);
        bVar12 = (byte)uVar10;
        uVar21 = CONCAT11(bVar12,bVar11);
        auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar16));
        auVar32._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar24._4_4_;
        auVar32._0_4_ = (uint)(bVar11 & 1) * auVar24._0_4_;
        auVar32._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar24._8_4_;
        auVar32._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar24._12_4_;
        auVar32._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar24._16_4_;
        auVar32._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar24._20_4_;
        auVar32._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar24._24_4_;
        auVar32._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar24._28_4_;
        auVar32._32_4_ = (uint)(bVar12 & 1) * auVar24._32_4_;
        auVar32._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar24._36_4_;
        auVar32._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar24._40_4_;
        auVar32._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar24._44_4_;
        auVar32._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar24._48_4_;
        auVar32._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar24._52_4_;
        auVar32._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar24._56_4_;
        auVar32._60_4_ = (uint)(bVar12 >> 7) * auVar24._60_4_;
        auVar24 = vpmulld_avx512f(auVar32,auVar27);
        uVar16 = uVar16 + 0x10;
      } while ((uVar13 + 0xf & 0x1fffffff0) != uVar16);
      auVar23 = vmovdqa32_avx512f(auVar24);
      auVar33._0_4_ = (uint)(bVar11 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar27._0_4_
      ;
      bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar33._4_4_ = (uint)bVar7 * auVar23._4_4_ | (uint)!bVar7 * auVar27._4_4_;
      bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar33._8_4_ = (uint)bVar7 * auVar23._8_4_ | (uint)!bVar7 * auVar27._8_4_;
      bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar33._12_4_ = (uint)bVar7 * auVar23._12_4_ | (uint)!bVar7 * auVar27._12_4_;
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar33._16_4_ = (uint)bVar7 * auVar23._16_4_ | (uint)!bVar7 * auVar27._16_4_;
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar33._20_4_ = (uint)bVar7 * auVar23._20_4_ | (uint)!bVar7 * auVar27._20_4_;
      bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar33._24_4_ = (uint)bVar7 * auVar23._24_4_ | (uint)!bVar7 * auVar27._24_4_;
      bVar7 = (bool)((byte)(uVar21 >> 7) & 1);
      auVar33._28_4_ = (uint)bVar7 * auVar23._28_4_ | (uint)!bVar7 * auVar27._28_4_;
      auVar33._32_4_ =
           (uint)(bVar12 & 1) * auVar23._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar27._32_4_;
      bVar7 = (bool)(bVar12 >> 1 & 1);
      auVar33._36_4_ = (uint)bVar7 * auVar23._36_4_ | (uint)!bVar7 * auVar27._36_4_;
      bVar7 = (bool)(bVar12 >> 2 & 1);
      auVar33._40_4_ = (uint)bVar7 * auVar23._40_4_ | (uint)!bVar7 * auVar27._40_4_;
      bVar7 = (bool)(bVar12 >> 3 & 1);
      auVar33._44_4_ = (uint)bVar7 * auVar23._44_4_ | (uint)!bVar7 * auVar27._44_4_;
      bVar7 = (bool)(bVar12 >> 4 & 1);
      auVar33._48_4_ = (uint)bVar7 * auVar23._48_4_ | (uint)!bVar7 * auVar27._48_4_;
      bVar7 = (bool)(bVar12 >> 5 & 1);
      auVar33._52_4_ = (uint)bVar7 * auVar23._52_4_ | (uint)!bVar7 * auVar27._52_4_;
      bVar7 = (bool)(bVar12 >> 6 & 1);
      auVar33._56_4_ = (uint)bVar7 * auVar23._56_4_ | (uint)!bVar7 * auVar27._56_4_;
      auVar33._60_4_ =
           (uint)(bVar12 >> 7) * auVar23._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar27._60_4_;
      auVar22 = vextracti64x4_avx512f(auVar33,1);
      auVar23 = vpmulld_avx512f(auVar33,ZEXT3264(auVar22));
      auVar8 = vpmulld_avx(auVar23._0_16_,auVar23._16_16_);
      auVar9 = vpshufd_avx(auVar8,0xee);
      auVar8 = vpmulld_avx(auVar8,auVar9);
      auVar9 = vpshufd_avx(auVar8,0x55);
      auVar8 = vpmulld_avx(auVar8,auVar9);
      iVar39 = auVar8._0_4_;
    }
    uVar19 = iVar39 * (dEdf->d).bd;
    local_c0.
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
    .m_d.lhsImpl.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
    .m_d.lhsImpl.
    super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>.
    super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
    .m_outerStride.m_value = (long)uVar19;
    if (uVar19 == uVar15) {
      uVar19 = iVar38 * (pTVar2->d).bd;
      local_c0.
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
      .m_d.rhsImpl.
      super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value = (long)uVar19;
      if (uVar15 - uVar19 == 0) {
        local_c0.
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
        .m_d.rhsImpl.
        super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
        .
        super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
        .m_data = pTVar2->v;
        local_c0.
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
        .m_d.lhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
        .m_d.rhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
        .m_d.lhsImpl.
        super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
        .
        super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
        .m_data = pTVar3->v;
        local_c0.
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
        .m_d.lhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
        .m_d.lhsImpl.
        super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
        .
        super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
        .m_data = dEdf->v;
        local_d8 = dEdxi->v;
        uVar13 = (ulong)(dEdxi->d).nd;
        if (uVar13 == 0) {
          iVar38 = 1;
        }
        else {
          auVar23 = vpbroadcastq_avx512f();
          auVar24 = vpbroadcastd_avx512f(ZEXT416(1));
          uVar16 = 0;
          auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          do {
            auVar27 = vmovdqa64_avx512f(auVar24);
            auVar24 = vpbroadcastq_avx512f();
            auVar28 = vporq_avx512f(auVar24,auVar25);
            auVar24 = vporq_avx512f(auVar24,auVar26);
            uVar10 = vpcmpuq_avx512f(auVar24,auVar23,2);
            bVar11 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar28,auVar23,2);
            bVar12 = (byte)uVar10;
            uVar21 = CONCAT11(bVar12,bVar11);
            auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar16));
            auVar36._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar24._4_4_;
            auVar36._0_4_ = (uint)(bVar11 & 1) * auVar24._0_4_;
            auVar36._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar24._8_4_;
            auVar36._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar24._12_4_;
            auVar36._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar24._16_4_;
            auVar36._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar24._20_4_;
            auVar36._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar24._24_4_;
            auVar36._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar24._28_4_;
            auVar36._32_4_ = (uint)(bVar12 & 1) * auVar24._32_4_;
            auVar36._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar24._36_4_;
            auVar36._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar24._40_4_;
            auVar36._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar24._44_4_;
            auVar36._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar24._48_4_;
            auVar36._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar24._52_4_;
            auVar36._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar24._56_4_;
            auVar36._60_4_ = (uint)(bVar12 >> 7) * auVar24._60_4_;
            auVar24 = vpmulld_avx512f(auVar36,auVar27);
            uVar16 = uVar16 + 0x10;
          } while ((uVar13 + 0xf & 0x1fffffff0) != uVar16);
          auVar23 = vmovdqa32_avx512f(auVar24);
          auVar37._0_4_ =
               (uint)(bVar11 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar27._0_4_;
          bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
          auVar37._4_4_ = (uint)bVar7 * auVar23._4_4_ | (uint)!bVar7 * auVar27._4_4_;
          bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
          auVar37._8_4_ = (uint)bVar7 * auVar23._8_4_ | (uint)!bVar7 * auVar27._8_4_;
          bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
          auVar37._12_4_ = (uint)bVar7 * auVar23._12_4_ | (uint)!bVar7 * auVar27._12_4_;
          bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
          auVar37._16_4_ = (uint)bVar7 * auVar23._16_4_ | (uint)!bVar7 * auVar27._16_4_;
          bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
          auVar37._20_4_ = (uint)bVar7 * auVar23._20_4_ | (uint)!bVar7 * auVar27._20_4_;
          bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
          auVar37._24_4_ = (uint)bVar7 * auVar23._24_4_ | (uint)!bVar7 * auVar27._24_4_;
          bVar7 = (bool)((byte)(uVar21 >> 7) & 1);
          auVar37._28_4_ = (uint)bVar7 * auVar23._28_4_ | (uint)!bVar7 * auVar27._28_4_;
          auVar37._32_4_ =
               (uint)(bVar12 & 1) * auVar23._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar27._32_4_;
          bVar7 = (bool)(bVar12 >> 1 & 1);
          auVar37._36_4_ = (uint)bVar7 * auVar23._36_4_ | (uint)!bVar7 * auVar27._36_4_;
          bVar7 = (bool)(bVar12 >> 2 & 1);
          auVar37._40_4_ = (uint)bVar7 * auVar23._40_4_ | (uint)!bVar7 * auVar27._40_4_;
          bVar7 = (bool)(bVar12 >> 3 & 1);
          auVar37._44_4_ = (uint)bVar7 * auVar23._44_4_ | (uint)!bVar7 * auVar27._44_4_;
          bVar7 = (bool)(bVar12 >> 4 & 1);
          auVar37._48_4_ = (uint)bVar7 * auVar23._48_4_ | (uint)!bVar7 * auVar27._48_4_;
          bVar7 = (bool)(bVar12 >> 5 & 1);
          auVar37._52_4_ = (uint)bVar7 * auVar23._52_4_ | (uint)!bVar7 * auVar27._52_4_;
          bVar7 = (bool)(bVar12 >> 6 & 1);
          auVar37._56_4_ = (uint)bVar7 * auVar23._56_4_ | (uint)!bVar7 * auVar27._56_4_;
          auVar37._60_4_ =
               (uint)(bVar12 >> 7) * auVar23._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar27._60_4_;
          auVar22 = vextracti64x4_avx512f(auVar37,1);
          auVar23 = vpmulld_avx512f(auVar37,ZEXT3264(auVar22));
          auVar8 = vpmulld_avx(auVar23._0_16_,auVar23._16_16_);
          auVar9 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          auVar9 = vpshufd_avx(auVar8,0x55);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          iVar38 = auVar8._0_4_;
        }
        uVar15 = iVar38 * (dEdxi->d).bd;
        local_d0 = (ulong)uVar15;
        local_c0.
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
        .m_d.lhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
        .m_d.rhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
        .m_d.rhsImpl.
        super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
        .
        super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
        .m_data = local_c0.
                  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
                  .m_d.lhsImpl.
                  super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
                  .
                  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
                  .m_d.rhsImpl.
                  super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  .
                  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
                  .m_d.lhsImpl.
                  super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  .
                  super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                  .m_data;
        local_c0.
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
        .m_d.lhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
        .m_d.rhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
        .m_d.rhsImpl.
        super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
        .
        super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
        .m_outerStride.m_value =
             local_c0.
             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
             .m_d.lhsImpl.
             super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
             .
             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
             .m_d.rhsImpl.
             super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
             .
             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
             .m_d.lhsImpl.
             super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
             .
             super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
             .m_outerStride.m_value;
        if (uVar15 == uVar19) {
          local_30.m_dst = &local_48;
          local_30.m_src = &local_c0;
          local_30.m_functor = &local_d9;
          local_30.m_dstExpr = (DstXprType *)&local_d8;
          local_48.
          super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
          .m_data = local_d8;
          local_48.
          super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
          .m_outerStride.m_value = local_d0;
          Eigen::internal::
          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>,_3,_0>
          ::run(&local_30);
          return;
        }
        pcVar14 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::sub_assign_op<float, float>]"
        ;
        goto LAB_001c2949;
      }
      pcVar14 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
      ;
    }
    else {
      pcVar14 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>]"
      ;
    }
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar14);
}

Assistant:

void CwiseQuotient::backward_impl(const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  assert(i < 2);
#ifdef HAVE_CUDA
  throw std::runtime_error("CwiseQuotient::backward not yet implemented for CUDA");
#else
  if (i == 0) {
    auto x2 = xs[1]->vec();
    dEdxi.vec() += dEdf.vec().cwiseQuotient(x2);
  } else { // i = 1
    auto x1 = xs[0]->vec();
    auto x2 = xs[1]->vec();
    dEdxi.vec() -= dEdf.vec().cwiseQuotient(x2.cwiseProduct(x2)).cwiseProduct(x1);
  }
#endif
}